

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O2

VkSparseImageMemoryBind *
vkt::sparse::makeSparseImageMemoryBind
          (VkSparseImageMemoryBind *__return_storage_ptr__,DeviceInterface *vk,VkDevice device,
          VkDeviceSize allocationSize,deUint32 memoryType,VkImageSubresource *subresource,
          VkOffset3D *offset,VkExtent3D *extent)

{
  deUint32 dVar1;
  deInt32 dVar2;
  VkResult result;
  VkDeviceMemory local_50;
  undefined4 local_48 [2];
  undefined8 local_40;
  VkDeviceSize local_38;
  deUint32 local_30;
  
  local_48[0] = 5;
  local_40 = 0;
  local_50.m_internal = 0;
  local_38 = allocationSize;
  local_30 = memoryType;
  result = (*vk->_vptr_DeviceInterface[5])(vk,device,local_48,0,&local_50);
  ::vk::checkResult(result,"vk.allocateMemory(device, &allocInfo, DE_NULL, &deviceMemory)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesTestsUtil.cpp"
                    ,0x316);
  (__return_storage_ptr__->subresource).arrayLayer = subresource->arrayLayer;
  dVar1 = subresource->mipLevel;
  (__return_storage_ptr__->subresource).aspectMask = subresource->aspectMask;
  (__return_storage_ptr__->subresource).mipLevel = dVar1;
  (__return_storage_ptr__->memory).m_internal = local_50.m_internal;
  __return_storage_ptr__->memoryOffset = 0;
  __return_storage_ptr__->flags = 0;
  (__return_storage_ptr__->offset).z = offset->z;
  dVar2 = offset->y;
  (__return_storage_ptr__->offset).x = offset->x;
  (__return_storage_ptr__->offset).y = dVar2;
  dVar1 = extent->height;
  (__return_storage_ptr__->extent).width = extent->width;
  (__return_storage_ptr__->extent).height = dVar1;
  (__return_storage_ptr__->extent).depth = extent->depth;
  return __return_storage_ptr__;
}

Assistant:

VkSparseImageMemoryBind	makeSparseImageMemoryBind  (const DeviceInterface&		vk,
													const VkDevice				device,
													const VkDeviceSize			allocationSize,
													const deUint32				memoryType,
													const VkImageSubresource&	subresource,
													const VkOffset3D&			offset,
													const VkExtent3D&			extent)
{
	const VkMemoryAllocateInfo	allocInfo =
	{
		VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	//	VkStructureType			sType;
		DE_NULL,								//	const void*				pNext;
		allocationSize,							//	VkDeviceSize			allocationSize;
		memoryType,								//	deUint32				memoryTypeIndex;
	};

	VkDeviceMemory deviceMemory = 0;
	VK_CHECK(vk.allocateMemory(device, &allocInfo, DE_NULL, &deviceMemory));

	VkSparseImageMemoryBind imageMemoryBind;

	imageMemoryBind.subresource		= subresource;
	imageMemoryBind.memory			= deviceMemory;
	imageMemoryBind.memoryOffset	= 0u;
	imageMemoryBind.flags			= 0u;
	imageMemoryBind.offset			= offset;
	imageMemoryBind.extent			= extent;

	return imageMemoryBind;
}